

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageMipmaps(Image *image)

{
  Image image_00;
  Image image_01;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  void *pvVar6;
  undefined8 in_stack_ffffffffffffffa0;
  int local_4c;
  undefined1 auStack_48 [4];
  int i;
  Image imCopy;
  uchar *nextmip;
  void *temp;
  int mipSize;
  int mipHeight;
  int mipWidth;
  int mipCount;
  Image *image_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    mipHeight = 1;
    mipSize = image->width;
    temp._4_4_ = image->height;
    temp._0_4_ = GetPixelDataSize(mipSize,temp._4_4_,image->format);
    while (mipSize != 1 || temp._4_4_ != 1) {
      if (mipSize != 1) {
        mipSize = mipSize / 2;
      }
      if (temp._4_4_ != 1) {
        temp._4_4_ = temp._4_4_ / 2;
      }
      if (mipSize < 1) {
        mipSize = 1;
      }
      if (temp._4_4_ < 1) {
        temp._4_4_ = 1;
      }
      mipHeight = mipHeight + 1;
      iVar5 = GetPixelDataSize(mipSize,temp._4_4_,image->format);
      temp._0_4_ = iVar5 + (int)temp;
    }
    if (image->mipmaps < mipHeight) {
      pvVar6 = realloc(image->data,(long)(int)temp);
      if (pvVar6 == (void *)0x0) {
        TraceLog(4,"IMAGE: Mipmaps required memory could not be allocated");
      }
      else {
        image->data = pvVar6;
      }
      pvVar6 = image->data;
      iVar5 = GetPixelDataSize(image->width,image->height,image->format);
      imCopy._16_8_ = (long)pvVar6 + (long)iVar5;
      mipSize = image->width / 2;
      temp._4_4_ = image->height / 2;
      temp._0_4_ = GetPixelDataSize(mipSize,temp._4_4_,image->format);
      uVar1 = image->width;
      uVar2 = image->height;
      uVar3 = image->mipmaps;
      uVar4 = image->format;
      image_00.height = uVar4;
      image_00.width = uVar3;
      image_00.data._4_4_ = uVar2;
      image_00.data._0_4_ = uVar1;
      image_00.mipmaps = (int)in_stack_ffffffffffffffa0;
      image_00.format = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
      ImageCopy(image_00);
      for (local_4c = 1; local_4c < mipHeight; local_4c = local_4c + 1) {
        ImageResize((Image *)auStack_48,mipSize,temp._4_4_);
        memcpy((void *)imCopy._16_8_,_auStack_48,(long)(int)temp);
        imCopy._16_8_ = imCopy._16_8_ + (long)(int)temp;
        image->mipmaps = image->mipmaps + 1;
        mipSize = mipSize / 2;
        temp._4_4_ = temp._4_4_ / 2;
        if (mipSize < 1) {
          mipSize = 1;
        }
        if (temp._4_4_ < 1) {
          temp._4_4_ = 1;
        }
        temp._0_4_ = GetPixelDataSize(mipSize,temp._4_4_,image->format);
      }
      image_01.width = imCopy.width;
      image_01.height = imCopy.height;
      image_01.data = imCopy.data;
      image_01.mipmaps = (int)in_stack_ffffffffffffffa0;
      image_01.format = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
      UnloadImage(image_01);
    }
    else {
      TraceLog(4,"IMAGE: Mipmaps already available");
    }
  }
  return;
}

Assistant:

void ImageMipmaps(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    int mipCount = 1;                   // Required mipmap levels count (including base level)
    int mipWidth = image->width;        // Base image width
    int mipHeight = image->height;      // Base image height
    int mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);  // Image data size (in bytes)

    // Count mipmap levels required
    while ((mipWidth != 1) || (mipHeight != 1))
    {
        if (mipWidth != 1) mipWidth /= 2;
        if (mipHeight != 1) mipHeight /= 2;

        // Security check for NPOT textures
        if (mipWidth < 1) mipWidth = 1;
        if (mipHeight < 1) mipHeight = 1;

        TRACELOGD("IMAGE: Next mipmap level: %i x %i - current size %i", mipWidth, mipHeight, mipSize);

        mipCount++;
        mipSize += GetPixelDataSize(mipWidth, mipHeight, image->format);       // Add mipmap size (in bytes)
    }

    if (image->mipmaps < mipCount)
    {
        void *temp = RL_REALLOC(image->data, mipSize);

        if (temp != NULL) image->data = temp;      // Assign new pointer (new size) to store mipmaps data
        else TRACELOG(LOG_WARNING, "IMAGE: Mipmaps required memory could not be allocated");

        // Pointer to allocated memory point where store next mipmap level data
        unsigned char *nextmip = (unsigned char *)image->data + GetPixelDataSize(image->width, image->height, image->format);

        mipWidth = image->width/2;
        mipHeight = image->height/2;
        mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);
        Image imCopy = ImageCopy(*image);

        for (int i = 1; i < mipCount; i++)
        {
            TRACELOGD("IMAGE: Generating mipmap level: %i (%i x %i) - size: %i - offset: 0x%x", i, mipWidth, mipHeight, mipSize, nextmip);

            ImageResize(&imCopy, mipWidth, mipHeight);  // Uses internally Mitchell cubic downscale filter

            memcpy(nextmip, imCopy.data, mipSize);
            nextmip += mipSize;
            image->mipmaps++;

            mipWidth /= 2;
            mipHeight /= 2;

            // Security check for NPOT textures
            if (mipWidth < 1) mipWidth = 1;
            if (mipHeight < 1) mipHeight = 1;

            mipSize = GetPixelDataSize(mipWidth, mipHeight, image->format);
        }

        UnloadImage(imCopy);
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Mipmaps already available");
}